

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableBase.cpp
# Opt level: O0

void __thiscall adios2::core::VariableBase::CheckDimensions(VariableBase *this,string *hint)

{
  bool bVar1;
  string *in_RSI;
  long in_RDI;
  string *in_stack_00000088;
  VariableBase *in_stack_00000090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffeb0;
  allocator *paVar2;
  string local_138 [24];
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  string *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [39];
  undefined1 local_91 [40];
  undefined1 local_69 [56];
  allocator local_31;
  string local_30 [48];
  
  if ((*(int *)(in_RDI + 0x40) == 2) &&
     ((bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                         (in_stack_fffffffffffffeb0), bVar1 ||
      (bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                         (in_stack_fffffffffffffeb0), bVar1)))) {
    paVar2 = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Core",paVar2);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_69 + 1),"VariableBase",(allocator *)__lhs);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_91;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_91 + 1),"CheckDimensions",(allocator *)__rhs);
    std::operator+((char *)in_stack_fffffffffffffee8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    std::operator+(__lhs,(char *)__rhs);
    std::operator+(__lhs,__rhs);
    std::operator+(__lhs,(char *)__rhs);
    helper::Throw<std::invalid_argument>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
    std::__cxx11::string::~string((string *)(local_91 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_91);
    std::__cxx11::string::~string((string *)(local_69 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  std::__cxx11::string::string(local_138,in_RSI);
  CheckDimensionsCommon(in_stack_00000090,in_stack_00000088);
  std::__cxx11::string::~string(local_138);
  return;
}

Assistant:

void VariableBase::CheckDimensions(const std::string hint) const
{
    if (m_ShapeID == ShapeID::GlobalArray)
    {
        if (m_Start.empty() || m_Count.empty())
        {
            helper::Throw<std::invalid_argument>(
                "Core", "VariableBase", "CheckDimensions",
                "GlobalArray variable " + m_Name +
                    " start and count dimensions must be defined by either "
                    "IO.DefineVariable or Variable.SetSelection, " +
                    hint + "\n");
        }
    }

    CheckDimensionsCommon(hint);
}